

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dnnplant.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  NaPNEvent NVar1;
  undefined8 *puVar2;
  double *pdVar3;
  int in_EDI;
  NaException *ex;
  NaException *ex_2;
  NaException *ex_1;
  NaPNEvent pnev;
  uint iSkip_yt;
  uint iDelay_yt;
  uint iSkip_y;
  uint iSkip_u;
  uint iDelay_y;
  uint iDelay_u;
  uint *output_delays;
  uint *input_delays;
  NaNNRegrPlantLearn nnroe;
  NaNNUnit au_nn;
  NaNeuralNetDescr nn_descr;
  NaNNRegrPlantLearn *this;
  NaNNRegrPlantLearn *in_stack_ffffffffffffdef0;
  undefined8 uVar4;
  NaNNRegrPlantLearn *in_stack_ffffffffffffdf08;
  undefined4 in_stack_ffffffffffffdf70;
  undefined4 in_stack_ffffffffffffdf74;
  undefined8 in_stack_ffffffffffffdf78;
  NaAlgorithmKind akind;
  NaNNRegrPlantLearn *in_stack_ffffffffffffdf80;
  char local_1fd8 [216];
  char local_1f00 [216];
  undefined1 local_1e28 [296];
  char local_1d00 [160];
  char local_1c60 [160];
  NaNNUnit local_1bc0 [1520];
  char local_15d0 [296];
  undefined1 local_14a8 [8];
  undefined1 auStack_14a0 [944];
  undefined1 local_10f0 [464];
  undefined1 local_f20 [464];
  undefined1 local_d50 [464];
  undefined1 local_b80 [408];
  undefined1 local_9e8 [408];
  undefined1 local_850 [416];
  NaNNUnit local_6b0 [152];
  uint local_618;
  uint local_614;
  NaNeuralNetDescr local_b0 [172];
  int local_4;
  
  akind = (NaAlgorithmKind)((ulong)in_stack_ffffffffffffdf78 >> 0x20);
  local_4 = 0;
  if (in_EDI == 5) {
    NaOpenLogFile("dnnplant.log");
    NaNeuralNetDescr::NaNeuralNetDescr(local_b0,1,1);
    NaNNUnit::NaNNUnit(local_6b0,local_b0);
    NaNNUnit::Load((char *)local_6b0);
    NaNNRegrPlantLearn::NaNNRegrPlantLearn
              (in_stack_ffffffffffffdf80,akind,
               (char *)CONCAT44(in_stack_ffffffffffffdf74,in_stack_ffffffffffffdf70));
    NaPNNNUnit::set_transfer_func(local_1bc0);
    NaNeuralNetDescr::InputDelays();
    NaNeuralNetDescr::OutputDelays();
    NaPNDelay::set_delay((uint)local_f20,(uint *)(ulong)local_618);
    NaPNDelay::set_delay((uint)local_10f0,(uint *)(ulong)local_614);
    NaPNDelay::get_max_delay();
    NaPNDelay::get_max_delay();
    NaPNSkip::set_skip_number((uint)local_9e8);
    NaPNSkip::set_skip_number((uint)local_b80);
    NaPNSkip::set_skip_number((uint)local_850);
    NaPNDelay::set_delay((uint)local_d50);
    NaPNDelay::add_delay((uint)local_d50);
    NaPNFetcher::set_output((uint)local_1e28,0);
    NaPNFileInput::set_input_filename(local_1f00);
    NaPNFileInput::set_input_filename(local_1fd8);
    NaPNFileOutput::set_output_filename(local_1c60);
    NaPNFileOutput::set_output_filename(local_1d00);
    NaNNRegrPlantLearn::link_net(in_stack_ffffffffffffdef0);
    NVar1 = NaNNRegrPlantLearn::run_net(in_stack_ffffffffffffdf08);
    NaPrintLog("IMPORTANT: net is dead due to ");
    switch(NVar1) {
    case pneDead:
      NaPrintLog("data are exhausted.\n");
      break;
    case pneHalted:
      NaPrintLog("internal halt.\n");
      break;
    case pneTerminate:
      NaPrintLog("user break.\n");
      break;
    case pneError:
      NaPrintLog("some error occured.\n");
      break;
    default:
      NaPrintLog("unknown reason.\n");
    }
    puVar2 = (undefined8 *)NaVector::operator[]((uint)local_14a8);
    uVar4 = *puVar2;
    pdVar3 = (double *)NaVector::operator[]((int)auStack_14a0 - 8);
    this = (NaNNRegrPlantLearn *)*pdVar3;
    pdVar3 = (double *)NaVector::operator[]((int)&stack0xffffffffffffdee0 + 0xee8);
    printf("MSE=%g (%g)\n",uVar4,(double)this / *pdVar3);
    NaPNStatistics::print_stat(local_15d0,(_IO_FILE *)0x0);
    NaNNRegrPlantLearn::~NaNNRegrPlantLearn(this);
    NaNNUnit::~NaNNUnit(local_6b0);
    NaNeuralNetDescr::~NaNeuralNetDescr(local_b0);
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"Usage: dnnplant NNP-File u-File y-File y_nn-File\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(5 != argc)
    {
      fprintf(stderr, "Usage: dnnplant NNP-File u-File y-File y_nn-File\n");
      return 1;
    }

  NaOpenLogFile("dnnplant.log");

  try{
    // Neural network description
    NaNeuralNetDescr	nn_descr;

    // Read neural network from file
    NaNNUnit		au_nn(nn_descr);
    au_nn.Load(argv[1]);

    NaNNRegrPlantLearn	nnroe(NaEvaluationAlgorithm);	// test

    // Configure nodes
    nnroe.nnplant.set_transfer_func(&au_nn);

    unsigned	*input_delays = au_nn.descr.InputDelays();
    unsigned	*output_delays = au_nn.descr.OutputDelays();

    nnroe.delay_u.set_delay(au_nn.descr.nInputsRepeat, input_delays);
    nnroe.delay_y.set_delay(au_nn.descr.nOutputsRepeat, output_delays);

    unsigned	iDelay_u = nnroe.delay_u.get_max_delay();
    unsigned	iDelay_y = nnroe.delay_y.get_max_delay();
    unsigned	iSkip_u = 0, iSkip_y = 0;
    unsigned	iDelay_yt, iSkip_yt;

    // Skip u or y due to absent earlier values of y or u
    if(iDelay_y >= iDelay_u)
      {
	iSkip_u = iDelay_y - iDelay_u + 1;
      }
    else /* if(iDelay_u > iDelay_y) */
      {
	iSkip_y = iDelay_u - iDelay_y - 1;
      }
    iDelay_yt = iDelay_y + iSkip_y;
    iSkip_yt = 1 + iDelay_yt;

    nnroe.skip_u.set_skip_number(iSkip_u);

    nnroe.skip_y.set_skip_number(iSkip_y);

    // Additional delay for target value
    nnroe.skip_yt.set_skip_number(iSkip_yt);
    nnroe.delay_yt.set_delay(0);
    nnroe.delay_yt.add_delay(iDelay_yt);

    /*
    printf("delay_u=%d,  skip_u=%d\n", iDelay_u, iSkip_u);
    printf("delay_y=%d,  skip_y=%d\n", iDelay_y, iSkip_y);
    printf("delay_yt=%d,  skip_yt=%d\n", iDelay_yt, iSkip_yt);
    */

    // Duplicate input y series at the same time ticks as nn_y
    nnroe.fetch_y.set_output(0);

    nnroe.in_u.set_input_filename(argv[2]);
    nnroe.in_y.set_input_filename(argv[3]);
    nnroe.nn_y.set_output_filename(argv[4]);
    nnroe.tr_y.set_output_filename("/tmp/tr_y.dat");

    NaPNEvent   pnev;

    try{
      nnroe.link_net();
    }
    catch(NaException& ex){
      NaPrintLog("EXCEPTION at linkage phase: %s\n", NaExceptionMsg(ex));
      throw(ex);
    }

    try{
      pnev = nnroe.run_net();

      NaPrintLog("IMPORTANT: net is dead due to ");
      switch(pnev){
      case pneTerminate:
	NaPrintLog("user break.\n");
	break;

      case pneHalted:
	NaPrintLog("internal halt.\n");
	break;

      case pneDead:
	NaPrintLog("data are exhausted.\n");
	break;

      case pneError:
	NaPrintLog("some error occured.\n");
	break;

      default:
	NaPrintLog("unknown reason.\n");
	break;
      }
    }
    catch(NaException& ex){
      NaPrintLog("EXCEPTION at runtime phase: %s\n", NaExceptionMsg(ex));
      throw(ex);
    }

    printf("MSE=%g (%g)\n", nnroe.statan.RMS[0],
	   nnroe.statan.RMS[0] / nnroe.statan_y.RMS[0]);

    nnroe.statan.print_stat();

  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}